

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Combination_iterator.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::Combination_iterator::increment(Combination_iterator *this)

{
  value_type vVar1;
  reference pvVar2;
  uint local_18;
  uint local_14;
  uint s;
  uint j;
  Combination_iterator *this_local;
  
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&this->value_,0);
  if (*pvVar2 == this->n_ - this->k_) {
    this->is_end_ = true;
  }
  else {
    local_14 = this->k_ - 1;
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->value_,(ulong)local_14);
    if (*pvVar2 < this->n_ - 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->value_,(ulong)local_14);
      *pvVar2 = *pvVar2 + 1;
    }
    else {
      for (; local_14 != 0; local_14 = local_14 - 1) {
        pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->value_,(ulong)(local_14 - 1));
        if (*pvVar2 < ((this->n_ - this->k_) + local_14) - 1) {
          pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&this->value_,(ulong)(local_14 - 1));
          *pvVar2 = *pvVar2 + 1;
          for (local_18 = local_14; local_18 < this->k_; local_18 = local_18 + 1) {
            pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->value_,(ulong)(local_14 - 1));
            vVar1 = *pvVar2;
            pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (&this->value_,(ulong)local_18);
            *pvVar2 = (vVar1 + local_18) - (local_14 - 1);
          }
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void increment() {
    if (value_[0] == n_ - k_) {
      is_end_ = true;
      return;
    }
    uint j = k_ - 1;
    if (value_[j] < n_ - 1) {
      value_[j]++;
      return;
    }
    for (; j > 0; --j)
      if (value_[j - 1] < n_ - k_ + j - 1) {
        value_[j - 1]++;
        for (uint s = j; s < k_; s++) value_[s] = value_[j - 1] + s - (j - 1);
        return;
      }
  }